

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

char * stbi_zlib_decode_malloc_guesssize(char *buffer,int len,int initial_size,int *outlen)

{
  int iVar1;
  char *obuf;
  char *p;
  stbi__zbuf a;
  int *outlen_local;
  int initial_size_local;
  int len_local;
  char *buffer_local;
  
  a._4096_8_ = outlen;
  obuf = (char *)stbi__malloc((long)initial_size);
  if (obuf == (char *)0x0) {
    buffer_local = (char *)0x0;
  }
  else {
    a.zbuffer = (stbi_uc *)(buffer + len);
    p = buffer;
    iVar1 = stbi__do_zlib((stbi__zbuf *)&p,obuf,initial_size,1,1);
    if (iVar1 == 0) {
      free(a.zout);
      buffer_local = (char *)0x0;
    }
    else {
      if (a._4096_8_ != 0) {
        *(stbi__uint32 *)a._4096_8_ = a.code_buffer - (int)a.zout;
      }
      buffer_local = a.zout;
    }
  }
  return buffer_local;
}

Assistant:

STBIDEF char *stbi_zlib_decode_malloc_guesssize(const char *buffer, int len, int initial_size, int *outlen)
{
   stbi__zbuf a;
   char *p = (char *) stbi__malloc(initial_size);
   if (p == NULL) return NULL;
   a.zbuffer = (stbi_uc *) buffer;
   a.zbuffer_end = (stbi_uc *) buffer + len;
   if (stbi__do_zlib(&a, p, initial_size, 1, 1)) {
      if (outlen) *outlen = (int) (a.zout - a.zout_start);
      return a.zout_start;
   } else {
      STBI_FREE(a.zout_start);
      return NULL;
   }
}